

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O2

void __thiscall Application::fromAdmin(Application *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  long lVar2;
  DefaultApplVerID defaultApplVerID;
  MsgType msgType;
  FieldBase FStack_d8;
  FieldBase local_78;
  
  FIX::MsgType::MsgType((MsgType *)&local_78);
  FIX::FieldMap::getField((FieldMap *)(message + 0x70),&local_78);
  bVar1 = std::operator==(&local_78.m_string,"A");
  if (bVar1) {
    FIX::DefaultApplVerID::DefaultApplVerID((DefaultApplVerID *)&FStack_d8);
    bVar1 = FIX::FieldMap::isSetField((FieldMap *)message,FStack_d8.m_tag);
    if (bVar1) {
      FIX::FieldMap::getField((FieldMap *)message,&FStack_d8);
      lVar2 = FIX::Session::lookupSession(sessionID);
      std::__cxx11::string::_M_assign((string *)(lVar2 + 0x1f8));
    }
    FIX::FieldBase::~FieldBase(&FStack_d8);
  }
  FIX::FieldBase::~FieldBase(&local_78);
  return;
}

Assistant:

EXCEPT( FIX::FieldNotFound, FIX::IncorrectDataFormat, FIX::IncorrectTagValue, FIX::RejectLogon )
  {
    FIX::MsgType msgType;
    message.getHeader().getField( msgType );
    if(msgType == FIX::MsgType_Logon)
    {
      FIX::DefaultApplVerID defaultApplVerID;
      if(message.isSetField(defaultApplVerID))
      {
        message.getField(defaultApplVerID);
        FIX::Session::lookupSession(sessionID)->setSenderDefaultApplVerID(defaultApplVerID);
      }
    }
  }